

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_array_scan_state.cpp
# Opt level: O3

ArrowArrayScanState * __thiscall
duckdb::ArrowArrayScanState::GetChild(ArrowArrayScanState *this,idx_t child_idx)

{
  ArrowScanLocalState *state;
  ClientContext *context;
  iterator iVar1;
  pointer pAVar2;
  type pAVar3;
  tuple<duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_> this_00;
  unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
  *this_01;
  templated_unique_single_t child_p;
  __uniq_ptr_impl<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>_>
  local_38;
  idx_t local_30;
  
  local_30 = child_idx;
  iVar1 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->children)._M_h,&local_30);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    state = this->state;
    context = this->context;
    this_00.
    super__Tuple_impl<0UL,_duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_>
    .super__Head_base<0UL,_duckdb::ArrowArrayScanState_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_>
          )operator_new(0x78);
    ArrowArrayScanState((ArrowArrayScanState *)
                        this_00.
                        super__Tuple_impl<0UL,_duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_>
                        .super__Head_base<0UL,_duckdb::ArrowArrayScanState_*,_false>._M_head_impl,
                        state,context);
    local_38._M_t.
    super__Tuple_impl<0UL,_duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_>
    .super__Head_base<0UL,_duckdb::ArrowArrayScanState_*,_false>._M_head_impl =
         (tuple<duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_>)
         (tuple<duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_>)
         this_00.
         super__Tuple_impl<0UL,_duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_>
         .super__Head_base<0UL,_duckdb::ArrowArrayScanState_*,_false>._M_head_impl;
    pAVar3 = unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
             ::operator*((unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
                          *)&local_38);
    shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator=(&pAVar3->owned_data,&this->owned_data);
    ::std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ArrowArrayScanState,std::default_delete<duckdb::ArrowArrayScanState>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ArrowArrayScanState,std::default_delete<duckdb::ArrowArrayScanState>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<unsigned_long&,duckdb::unique_ptr<duckdb::ArrowArrayScanState,std::default_delete<duckdb::ArrowArrayScanState>,true>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ArrowArrayScanState,std::default_delete<duckdb::ArrowArrayScanState>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ArrowArrayScanState,std::default_delete<duckdb::ArrowArrayScanState>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->children,&local_30,&local_38);
    ::std::
    unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>_>::
    ~unique_ptr((unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>_>
                 *)&local_38);
  }
  else {
    this_01 = (unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
               *)((long)iVar1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>_>,_false>
                        ._M_cur + 0x10);
    pAVar2 = unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
             ::operator->(this_01);
    if ((pAVar2->owned_data).internal.
        super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      pAVar2 = unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
               ::operator->(this_01);
      shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator=(&pAVar2->owned_data,&this->owned_data);
    }
    pAVar3 = unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
             ::operator*(this_01);
  }
  return pAVar3;
}

Assistant:

ArrowArrayScanState &ArrowArrayScanState::GetChild(idx_t child_idx) {
	auto it = children.find(child_idx);
	if (it == children.end()) {
		auto child_p = make_uniq<ArrowArrayScanState>(state, context);
		auto &child = *child_p;
		child.owned_data = owned_data;
		children.emplace(child_idx, std::move(child_p));
		return child;
	}
	if (!it->second->owned_data) {
		// Propagate down the ownership, for dictionaries in children
		D_ASSERT(owned_data);
		it->second->owned_data = owned_data;
	}
	return *it->second;
}